

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

int ixmlNode_removeChild(IXML_Node *nodeptr,IXML_Node *oldChild,IXML_Node **returnNode)

{
  Nodeptr p_Var1;
  Nodeptr p_Var2;
  int iVar3;
  
  iVar3 = 0x69;
  if ((oldChild == (IXML_Node *)0x0 || nodeptr == (IXML_Node *)0x0) ||
     (iVar3 = 8, oldChild->parentNode != nodeptr)) {
    return iVar3;
  }
  p_Var1 = oldChild->prevSibling;
  if (p_Var1 != (Nodeptr)0x0) {
    p_Var1->nextSibling = oldChild->nextSibling;
  }
  p_Var2 = oldChild->nextSibling;
  if (nodeptr->firstChild == oldChild) {
    nodeptr->firstChild = p_Var2;
  }
  if (p_Var2 != (Nodeptr)0x0) {
    p_Var2->prevSibling = p_Var1;
  }
  oldChild->parentNode = (Nodeptr)0x0;
  oldChild->prevSibling = (Nodeptr)0x0;
  oldChild->nextSibling = (Nodeptr)0x0;
  if (returnNode != (IXML_Node **)0x0) {
    *returnNode = oldChild;
    return 0;
  }
  ixmlNode_free(oldChild);
  return 0;
}

Assistant:

int ixmlNode_removeChild(
	IXML_Node *nodeptr, IXML_Node *oldChild, IXML_Node **returnNode)
{
	if (!nodeptr || !oldChild)
		return IXML_INVALID_PARAMETER;
	if (!ixmlNode_isParent(nodeptr, oldChild))
		return IXML_NOT_FOUND_ERR;
	if (oldChild->prevSibling)
		oldChild->prevSibling->nextSibling = oldChild->nextSibling;
	if (nodeptr->firstChild == oldChild)
		nodeptr->firstChild = oldChild->nextSibling;
	if (oldChild->nextSibling)
		oldChild->nextSibling->prevSibling = oldChild->prevSibling;
	oldChild->nextSibling = NULL;
	oldChild->prevSibling = NULL;
	oldChild->parentNode = NULL;
	if (returnNode)
		*returnNode = oldChild;
	else
		ixmlNode_free(oldChild);

	return IXML_SUCCESS;
}